

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O2

cmBTStringRange __thiscall
cmStateDirectory::GetIncludeDirectoriesEntries_abi_cxx11_(cmStateDirectory *this)

{
  PointerType pBVar1;
  PointerType pSVar2;
  cmBTStringRange cVar3;
  
  pBVar1 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&(this->Snapshot_).Position);
  cVar3 = GetPropertyContent<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>,unsigned_long>
                    (&pBVar1->IncludeDirectories,pSVar2->IncludeDirectoryPosition);
  return cVar3;
}

Assistant:

cmBTStringRange cmStateDirectory::GetIncludeDirectoriesEntries() const
{
  return GetPropertyContent(
    this->DirectoryState->IncludeDirectories,
    this->Snapshot_.Position->IncludeDirectoryPosition);
}